

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O1

void __thiscall QRasterPaintEngine::fillRect(QRasterPaintEngine *this,QRectF *r,QBrush *brush)

{
  QPaintEngineState *pQVar1;
  QPaintEngineState *pQVar2;
  
  pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
  pQVar2 = pQVar1 + -2;
  if (pQVar1 == (QPaintEngineState *)0x0) {
    pQVar2 = (QPaintEngineState *)0x0;
  }
  if ((*(QBrushData **)&pQVar2[0xb8].dirtyFlags !=
       (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl) ||
     (pQVar2[0xfc].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
      super_QFlagsStorage<QPaintEngine::DirtyFlag>.i != 0)) {
    updateBrush(this,brush);
  }
  if (*(long *)(pQVar2 + 0xbc) != 0) {
    fillRect(this,r,(QSpanData *)(pQVar2 + 0xba));
    return;
  }
  return;
}

Assistant:

void QRasterPaintEngine::fillRect(const QRectF &r, const QBrush &brush)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << "QRasterPaintEngine::fillRecct(): " << r << brush;
#endif
    QRasterPaintEngineState *s = state();

    ensureBrush(brush);
    if (!s->brushData.blend)
        return;

    fillRect(r, &s->brushData);
}